

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mg_send_response_line(mg_connection *nc,int status_code,char *extra_headers)

{
  char *local_28;
  char *status_message;
  char *extra_headers_local;
  int status_code_local;
  mg_connection *nc_local;
  
  local_28 = "OK";
  if (status_code == 0xce) {
    local_28 = "Partial Content";
  }
  else if (status_code == 0x12d) {
    local_28 = "Moved";
  }
  else if (status_code == 0x12e) {
    local_28 = "Found";
  }
  else if (status_code == 0x1a0) {
    local_28 = "Requested range not satisfiable";
  }
  else if (status_code == 0x1a2) {
    local_28 = "I\'m a teapot";
  }
  mg_printf(nc,"HTTP/1.1 %d %s\r\n",(ulong)(uint)status_code,local_28);
  if (extra_headers != (char *)0x0) {
    mg_printf(nc,"%s\r\n",extra_headers);
  }
  return;
}

Assistant:

void mg_send_response_line(struct mg_connection *nc, int status_code,
                           const char *extra_headers) {
    const char *status_message = "OK";
    switch (status_code) {
        case 206:
            status_message = "Partial Content";
            break;
        case 301:
            status_message = "Moved";
            break;
        case 302:
            status_message = "Found";
            break;
        case 416:
            status_message = "Requested range not satisfiable";
            break;
        case 418:
            status_message = "I'm a teapot";
            break;
    }
    mg_printf(nc, "HTTP/1.1 %d %s\r\n", status_code, status_message);
    if (extra_headers != NULL) {
        mg_printf(nc, "%s\r\n", extra_headers);
    }
}